

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

int64_t __thiscall wallet::CWallet::IncOrderPosNext(CWallet *this,WalletBatch *batch)

{
  long lVar1;
  long lVar2;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int64_t nRet;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  WalletDatabase *in_stack_ffffffffffffffa0;
  CWallet *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff9c,(AnnotatedMixin<std::recursive_mutex> *)0x16fda19);
  lVar2 = *(long *)(in_RDI + 0x2c0);
  *(long *)(in_RDI + 0x2c0) = lVar2 + 1;
  if (in_RSI == 0) {
    GetDatabase(in_stack_ffffffffffffffa8);
    WalletBatch::WalletBatch
              ((WalletBatch *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
               SUB41((uint)in_stack_ffffffffffffff9c >> 0x18,0));
    WalletBatch::WriteOrderPosNext
              ((WalletBatch *)in_stack_ffffffffffffffa0,(int64_t)in_stack_ffffffffffffffa8);
    WalletBatch::~WalletBatch
              ((WalletBatch *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  else {
    WalletBatch::WriteOrderPosNext
              ((WalletBatch *)in_stack_ffffffffffffffa0,(int64_t)in_stack_ffffffffffffffa8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return lVar2;
  }
  __stack_chk_fail();
}

Assistant:

int64_t CWallet::IncOrderPosNext(WalletBatch* batch)
{
    AssertLockHeld(cs_wallet);
    int64_t nRet = nOrderPosNext++;
    if (batch) {
        batch->WriteOrderPosNext(nOrderPosNext);
    } else {
        WalletBatch(GetDatabase()).WriteOrderPosNext(nOrderPosNext);
    }
    return nRet;
}